

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  void *pvVar1;
  char *ssl_peer_key;
  int ietf_tls_id;
  Curl_cfilter *cf_00;
  Curl_easy *local_38;
  ssl_connect_data *connssl;
  Curl_easy *data;
  Curl_cfilter *cf;
  SSL_SESSION *ssl_sessionid_local;
  SSL *ssl_local;
  
  cf_00 = (Curl_cfilter *)SSL_get_ex_data((SSL *)ssl,0);
  if (cf_00 != (Curl_cfilter *)0x0) {
    if (cf_00 == (Curl_cfilter *)0x0) {
      local_38 = (Curl_easy *)0x0;
    }
    else {
      local_38 = *(Curl_easy **)((long)cf_00->ctx + 0x48);
    }
    pvVar1 = cf_00->ctx;
    ssl_peer_key = *(char **)((long)pvVar1 + 0x20);
    ietf_tls_id = SSL_version((SSL *)ssl);
    Curl_ossl_add_session
              (cf_00,local_38,ssl_peer_key,ssl_sessionid,ietf_tls_id,*(char **)((long)pvVar1 + 0x60)
               ,(uchar *)0x0,0);
  }
  return 0;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  struct Curl_cfilter *cf = (struct Curl_cfilter*) SSL_get_app_data(ssl);
  if(cf) {
    struct Curl_easy *data = CF_DATA_CURRENT(cf);
    struct ssl_connect_data *connssl = cf->ctx;
    Curl_ossl_add_session(cf, data, connssl->peer.scache_key, ssl_sessionid,
                          SSL_version(ssl), connssl->negotiated.alpn,
                          NULL, 0);
  }
  return 0;
}